

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_miniscript_concat
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              size_t target_num,size_t *reference_indexes,uchar *prev_insert,size_t prev_insert_num,
              uchar *first_insert,size_t first_insert_num,uchar *second_insert,
              size_t second_insert_num,uchar *last_append,size_t last_append_num,uchar *script,
              size_t script_len,size_t *write_len)

{
  miniscript_node_t *pmVar1;
  int iVar2;
  size_t sVar3;
  miniscript_node_t **ppmVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t output_len;
  uchar *local_58;
  size_t *local_50;
  miniscript_node_t *child [3];
  
  uVar6 = 0x208;
  if (script_len < 0x208) {
    uVar6 = script_len;
  }
  if ((node->child != (miniscript_node_t *)0x0) &&
     ((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)))) {
    uVar7 = first_insert_num + prev_insert_num + second_insert_num;
    local_50 = (size_t *)&DAT_001371e0;
    if (reference_indexes != (size_t *)0x0) {
      local_50 = reference_indexes;
    }
    local_58 = prev_insert;
    wally_bzero(child,0x18);
    sVar3 = 0;
    do {
      if (target_num == sVar3) {
        sVar3 = 0;
        uVar5 = 0;
        while( true ) {
          if (target_num == sVar3) {
            if (uVar6 < uVar7 + last_append_num) {
              return -2;
            }
            if (last_append_num != 0) {
              script[uVar5] = *last_append;
              uVar5 = uVar5 + 1;
            }
            *write_len = uVar5;
            return 0;
          }
          if (sVar3 == 0 && prev_insert_num != 0) {
            script[uVar5] = *local_58;
            uVar5 = uVar5 + 1;
          }
          else if (sVar3 == 1 && first_insert_num != 0) {
            memcpy(script + uVar5,first_insert,first_insert_num);
            uVar5 = uVar5 + first_insert_num;
          }
          else if (sVar3 == 2 && second_insert_num != 0) {
            script[uVar5] = *second_insert;
            uVar5 = uVar5 + 1;
          }
          output_len = 0;
          iVar2 = generate_script_from_miniscript
                            (child[local_50[sVar3]],node,derive_child_num,script + uVar5,
                             ~uVar5 + script_len,&output_len);
          if (iVar2 != 0) break;
          uVar7 = uVar7 + output_len;
          if (uVar6 < uVar7) {
            return -2;
          }
          uVar5 = uVar5 + output_len;
          sVar3 = sVar3 + 1;
        }
        return iVar2;
      }
      ppmVar4 = &node->child;
      if (sVar3 != 0) {
        ppmVar4 = &child[sVar3 - 1]->next;
      }
      pmVar1 = *ppmVar4;
      child[sVar3] = pmVar1;
      sVar3 = sVar3 + 1;
    } while (pmVar1 != (miniscript_node_t *)0x0);
  }
  return -2;
}

Assistant:

static int generate_by_miniscript_concat(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    size_t target_num,
    const size_t *reference_indexes,
    unsigned char *prev_insert,
    size_t prev_insert_num,
    unsigned char *first_insert,
    size_t first_insert_num,
    unsigned char *second_insert,
    size_t second_insert_num,
    unsigned char *last_append,
    size_t last_append_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t output_len;
    size_t total = prev_insert_num + first_insert_num + second_insert_num;
    size_t index = 0;
    size_t offset = 0;
    struct miniscript_node_t *child[3];
    size_t default_indexes[] = {0, 1, 2};
    const size_t *indexes = reference_indexes;
    size_t check_len = (DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE > script_len) ?
                       script_len : DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE;

    if (!node->child || (parent && !parent->info))
        return WALLY_EINVAL;

    if (!reference_indexes)
        indexes = default_indexes;

    wally_bzero(child, sizeof(child));

    for (index = 0; index < target_num; ++index) {
        child[index] = (index == 0) ? node->child : child[index - 1]->next;
        if (!child[index])
            return WALLY_EINVAL;
    }

    for (index = 0; index < target_num; ++index) {
        if ((index == 0) && prev_insert_num) {
            memcpy(script + offset, prev_insert, prev_insert_num);
            offset += prev_insert_num;
        }
        if ((index == 1) && first_insert_num) {
            memcpy(script + offset, first_insert, first_insert_num);
            offset += first_insert_num;
        }
        if ((index == 2) && second_insert_num) {
            memcpy(script + offset, second_insert, second_insert_num);
            offset += second_insert_num;
        }

        output_len = 0;
        ret = generate_script_from_miniscript(child[indexes[index]], node, derive_child_num,
                                              &script[offset], script_len - offset - 1,
                                              &output_len);
        if (ret != WALLY_OK)
            return ret;

        offset += output_len;
        total += output_len;
        if (total > check_len)
            return WALLY_EINVAL;
    }

    if (total + last_append_num > check_len)
        return WALLY_EINVAL;
    if (last_append_num) {
        memcpy(script + offset, last_append, last_append_num);
        offset += last_append_num;
    }

    if (ret == WALLY_OK)
        *write_len = offset;

    return ret;
}